

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# saigIsoFast.c
# Opt level: O1

Vec_Int_t * Iso_StoCollectInfo(Iso_Sto_t *p,Aig_Obj_t *pPo)

{
  ushort uVar1;
  int iVar2;
  int iVar3;
  Aig_Man_t *p_00;
  Iso_Dat_t *pIVar4;
  ulong uVar5;
  void **ppvVar6;
  int *__ptr;
  Vec_Int_t *pVVar7;
  int *piVar8;
  long lVar9;
  int iVar10;
  Aig_Obj_t *pObj;
  Vec_Ptr_t *pVVar11;
  long lVar12;
  
  if ((*(uint *)&pPo->field_0x18 & 7) != 3) {
    __assert_fail("Aig_ObjIsCo(pPo)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/saig/saigIsoFast.c"
                  ,0xba,"Vec_Int_t *Iso_StoCollectInfo(Iso_Sto_t *, Aig_Obj_t *)");
  }
  p_00 = p->pAig;
  pIVar4 = p->pData;
  p->vVisited->nSize = 0;
  pVVar11 = p->vRoots;
  pVVar11->nSize = 0;
  if (pVVar11->nCap == 0) {
    if (pVVar11->pArray == (void **)0x0) {
      ppvVar6 = (void **)malloc(0x80);
    }
    else {
      ppvVar6 = (void **)realloc(pVVar11->pArray,0x80);
    }
    pVVar11->pArray = ppvVar6;
    pVVar11->nCap = 0x10;
  }
  iVar10 = pVVar11->nSize;
  pVVar11->nSize = iVar10 + 1;
  pVVar11->pArray[iVar10] = pPo;
  pVVar11 = p->vRoots;
  if (0 < pVVar11->nSize) {
    lVar12 = 0;
    do {
      uVar5 = *(ulong *)((long)pVVar11->pArray[lVar12] + 8);
      pObj = (Aig_Obj_t *)(uVar5 & 0xfffffffffffffffe);
      if ((*(uint *)&pObj->field_0x18 & 7) != 1) {
        Iso_StoCollectInfo_rec(p_00,pObj,(uint)uVar5 & 1,p->vVisited,p->pData,pVVar11);
      }
      lVar12 = lVar12 + 1;
      pVVar11 = p->vRoots;
    } while (lVar12 < pVVar11->nSize);
  }
  p->vPlaces->nSize = 0;
  pVVar7 = p->vVisited;
  if (0 < pVVar7->nSize) {
    lVar12 = 0;
    do {
      iVar10 = pVVar7->pArray[lVar12];
      uVar1 = *(ushort *)(pIVar4 + iVar10);
      iVar2 = p->pCounters[uVar1];
      p->pCounters[uVar1] = iVar2 + 1;
      if (iVar2 == 0) {
        Vec_IntPush(p->vPlaces,(uint)uVar1);
      }
      p->pData[iVar10] = (Iso_Dat_t)0x0;
      lVar12 = lVar12 + 1;
      pVVar7 = p->vVisited;
    } while (lVar12 < pVVar7->nSize);
  }
  pVVar7->nSize = 0;
  pVVar7 = p->vPlaces;
  if (0 < pVVar7->nSize) {
    lVar12 = 0;
    do {
      iVar10 = pVVar7->pArray[lVar12];
      if (p->pCounters[iVar10] == 0) {
        __assert_fail("p->pCounters[Entry]",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/saig/saigIsoFast.c"
                      ,0xd7,"Vec_Int_t *Iso_StoCollectInfo(Iso_Sto_t *, Aig_Obj_t *)");
      }
      Vec_IntPush(p->vVisited,p->pCounters[iVar10]);
      p->pCounters[iVar10] = 0;
      lVar12 = lVar12 + 1;
      pVVar7 = p->vPlaces;
    } while (lVar12 < pVVar7->nSize);
  }
  __ptr = Abc_MergeSortCost(p->vVisited->pArray,p->vVisited->nSize);
  iVar10 = *__ptr;
  if (-1 < (long)iVar10) {
    iVar2 = p->vVisited->nSize;
    if (iVar10 < iVar2) {
      iVar3 = __ptr[(long)iVar2 + -1];
      if ((-1 < (long)iVar3) && (iVar3 < iVar2)) {
        piVar8 = p->vVisited->pArray;
        if (piVar8[iVar3] < piVar8[iVar10]) {
          __assert_fail("Vec_IntEntry(p->vVisited, pPerm[0]) <= Vec_IntEntry(p->vVisited, pPerm[Vec_IntSize(p->vVisited)-1])"
                        ,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/saig/saigIsoFast.c"
                        ,0xdf,"Vec_Int_t *Iso_StoCollectInfo(Iso_Sto_t *, Aig_Obj_t *)");
        }
        pVVar7 = (Vec_Int_t *)malloc(0x10);
        iVar10 = 0x10;
        if (0xe < iVar2 - 1U) {
          iVar10 = iVar2;
        }
        pVVar7->nSize = 0;
        pVVar7->nCap = iVar10;
        if (iVar10 == 0) {
          piVar8 = (int *)0x0;
        }
        else {
          piVar8 = (int *)malloc((long)iVar10 << 2);
        }
        pVVar7->pArray = piVar8;
        if (0 < iVar2) {
          lVar12 = (long)iVar2 + 1;
          do {
            iVar10 = __ptr[lVar12 + -2];
            lVar9 = (long)iVar10;
            if (((lVar9 < 0) || (p->vVisited->nSize <= iVar10)) || (p->vPlaces->nSize <= iVar10))
            goto LAB_00627d20;
            Vec_IntPush(pVVar7,p->vVisited->pArray[lVar9] << 0x10 | p->vPlaces->pArray[lVar9]);
            lVar12 = lVar12 + -1;
          } while (1 < lVar12);
        }
        free(__ptr);
        return pVVar7;
      }
    }
  }
LAB_00627d20:
  __assert_fail("i >= 0 && i < p->nSize",
                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecInt.h"
                ,0x19e,"int Vec_IntEntry(Vec_Int_t *, int)");
}

Assistant:

Vec_Int_t * Iso_StoCollectInfo( Iso_Sto_t * p, Aig_Obj_t * pPo )
{
    int fVerboseShow = 0;
    Vec_Int_t * vInfo;
    Iso_Dat2_t * pData2 = (Iso_Dat2_t *)p->pData;
    Aig_Man_t * pAig = p->pAig;
    Aig_Obj_t * pObj;
    int i, Value, Entry, * pPerm;
//    abctime clk = Abc_Clock();

    assert( Aig_ObjIsCo(pPo) );

    // collect initial POs
    Vec_IntClear( p->vVisited );
    Vec_PtrClear( p->vRoots );
    Vec_PtrPush( p->vRoots, pPo );

    // mark internal nodes
    Vec_PtrForEachEntry( Aig_Obj_t *, p->vRoots, pObj, i )
        if ( !Aig_ObjIsConst1(Aig_ObjFanin0(pObj)) )
            Iso_StoCollectInfo_rec( pAig, Aig_ObjFanin0(pObj), Aig_ObjFaninC0(pObj), p->vVisited, p->pData, p->vRoots );
//    time_Trav += Abc_Clock() - clk;

    // count how many times each data entry appears
    Vec_IntClear( p->vPlaces );
    Vec_IntForEachEntry( p->vVisited, Entry, i )
    {
        Value = pData2[Entry].Data;
//        assert( Value > 0 );
        if ( p->pCounters[Value]++ == 0 )
            Vec_IntPush( p->vPlaces, Value );
//        pData2[Entry].Data = 0;
        *((int *)(p->pData + Entry)) = 0;
    }

    // collect non-trivial counters
    Vec_IntClear( p->vVisited );
    Vec_IntForEachEntry( p->vPlaces, Entry, i )
    {
        assert( p->pCounters[Entry] );
        Vec_IntPush( p->vVisited, p->pCounters[Entry] );
        p->pCounters[Entry] = 0;
    }
//    printf( "%d ", Vec_IntSize(p->vVisited) );

    // sort the costs in the increasing order
    pPerm = Abc_MergeSortCost( Vec_IntArray(p->vVisited), Vec_IntSize(p->vVisited) );
    assert( Vec_IntEntry(p->vVisited, pPerm[0]) <= Vec_IntEntry(p->vVisited, pPerm[Vec_IntSize(p->vVisited)-1]) );

    // create information
    vInfo = Vec_IntAlloc( Vec_IntSize(p->vVisited) );
    for ( i = Vec_IntSize(p->vVisited)-1; i >= 0; i-- )
    {
        Entry = Vec_IntEntry( p->vVisited, pPerm[i] );
        Entry = (Entry << AIG_ISO_NUM) | Vec_IntEntry( p->vPlaces, pPerm[i] );
        Vec_IntPush( vInfo, Entry );
    }
    ABC_FREE( pPerm );

    // show the final result
    if ( fVerboseShow )
    Vec_IntForEachEntry( vInfo, Entry, i )
    {
        Iso_Dat2_t Data = { Entry & 0xFFFF };
        Iso_Dat_t * pData = (Iso_Dat_t *)&Data;

        printf( "%6d : ", i );
        printf( "Freq =%6d ", Entry >> 16 );

        printf( "FiNeg =%3d ", pData->nFiNeg );
        printf( "FoNeg =%3d ", pData->nFoNeg );
        printf( "FoPos =%3d ", pData->nFoPos );
        printf( "Fi0L  =%3d ", pData->Fi0Lev );
        printf( "Fi1L  =%3d ", pData->Fi1Lev );
        printf( "Lev   =%3d ", pData->Level  );
        printf( "\n" );
    }
    return vInfo;
}